

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_formats.c
# Opt level: O2

void CMformat_preload(CMConnection conn,CMFormat format)

{
  CManager cm;
  FILE *pFVar1;
  int iVar2;
  __pid_t _Var3;
  undefined8 uVar4;
  pthread_t pVar5;
  FMFormat *pp_Var6;
  FILE *pFVar7;
  FMFormat ioformat;
  size_t size;
  timespec ts;
  
  cm = conn->cm;
  if (((conn->remote_format_server_ID == cm->FFSserver_identifier) &&
      (cm->FFSserver_identifier != -1)) && (conn->remote_format_server_ID - 1U < 0xfffffffe)) {
    return;
  }
  if (conn->closed != 0) {
    return;
  }
  size = 0x10;
  for (pp_Var6 = conn->preloaded_formats; pp_Var6 != (FMFormat *)0x0; pp_Var6 = pp_Var6 + 1) {
    ioformat = format->fmformat;
    if (*pp_Var6 == (FMFormat)0x0) goto LAB_00121ad2;
    if (*pp_Var6 == ioformat) {
      return;
    }
    size = size + 8;
  }
  ioformat = format->fmformat;
LAB_00121ad2:
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar2 = CMtrace_init(cm,CMFormatVerbose);
    if (iVar2 != 0) goto LAB_00121afe;
  }
  else if (CMtrace_val[6] != 0) {
LAB_00121afe:
    if (CMtrace_PID != 0) {
      pFVar7 = (FILE *)conn->cm->CMTrace_file;
      _Var3 = getpid();
      pVar5 = pthread_self();
      fprintf(pFVar7,"P%lxT%lx - ",(long)_Var3,pVar5);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&ts);
      fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
    }
    pFVar7 = (FILE *)conn->cm->CMTrace_file;
    uVar4 = name_of_FMformat(ioformat);
    fprintf(pFVar7,"CMpbio preloading format %s on connection %p\n",uVar4,conn);
  }
  fflush((FILE *)conn->cm->CMTrace_file);
  iVar2 = CMpbio_send_format_preload(ioformat,conn);
  if (iVar2 == 1) {
    pFVar7 = (FILE *)conn->cm->CMTrace_file;
    if (pFVar7 == (FILE *)0x0) {
      iVar2 = CMtrace_init(conn->cm,CMFormatVerbose);
      if (iVar2 == 0) goto LAB_00121d1d;
      pFVar7 = (FILE *)conn->cm->CMTrace_file;
    }
    else if (CMtrace_val[6] == 0) goto LAB_00121d1d;
    fwrite("CMpbio Preload is format ",0x19,1,pFVar7);
    pFVar1 = conn->cm->CMTrace_file;
    uVar4 = get_server_ID_FMformat(ioformat,&ts);
    fprint_server_ID(pFVar1,uVar4);
    fputc(10,(FILE *)conn->cm->CMTrace_file);
  }
  else if (conn->closed == 0) {
    iVar2 = CMtrace_val[6];
    if (conn->cm->CMTrace_file == (FILE *)0x0) {
      iVar2 = CMtrace_init(conn->cm,CMFormatVerbose);
    }
    if (iVar2 != 0) {
      if (CMtrace_PID != 0) {
        pFVar7 = (FILE *)conn->cm->CMTrace_file;
        _Var3 = getpid();
        pVar5 = pthread_self();
        fprintf(pFVar7,"P%lxT%lx - ",(long)_Var3,pVar5);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&ts);
        fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
      }
      fwrite("CMpbio preload failed\n",0x16,1,(FILE *)conn->cm->CMTrace_file);
    }
    fflush((FILE *)conn->cm->CMTrace_file);
  }
LAB_00121d1d:
  if (conn->preloaded_formats == (FMFormat *)0x0) {
    pp_Var6 = (FMFormat *)INT_CMmalloc(0x10);
  }
  else {
    pp_Var6 = (FMFormat *)INT_CMrealloc(conn->preloaded_formats,size);
  }
  *(FMFormat *)((long)pp_Var6 + (size - 0x10)) = format->fmformat;
  *(undefined8 *)((long)pp_Var6 + (size - 8)) = 0;
  conn->preloaded_formats = pp_Var6;
  return;
}

Assistant:

extern void
CMformat_preload(CMConnection conn, CMFormat format)
{
    int load_count = 0;
    FMFormat *loaded_list = conn->preloaded_formats;
    int my_FFSserver_ID = conn->cm->FFSserver_identifier;
    int remote_FFSserver_ID = conn->remote_format_server_ID;
    int preload = 0;

    if (my_FFSserver_ID == -1) preload = 1;   /* we're self hosting formats */
    if (remote_FFSserver_ID == -1) preload = 1;   /* they're self hosting formats */
    if (remote_FFSserver_ID == 0) preload = 1; /* 0 is the unset state, we don't know their server, preload to be safe */
    if (remote_FFSserver_ID != my_FFSserver_ID) preload = 1;  /* if we're both using a format server, but not the same one, preload */

    if (preload == 0) return;

    if (conn->closed) return;

    /* if (CMtrace_on(conn->cm, CMFormatVerbose)) { */
    /* 	int junk; */
    /* 	fprintf(conn->cm->CMTrace_file, "Considering CMpbio Preload of format "); */
    /* 	fprint_server_ID(conn->cm->CMTrace_file, (unsigned char *)get_server_ID_FMformat(format->fmformat, &junk)); */
    /* 	fprintf(conn->cm->CMTrace_file, " value %p\n", format); */
    /* } */
    while (loaded_list && (*loaded_list != NULL)) {
      if (*loaded_list == format->fmformat) return;
	loaded_list++;
	load_count++;
    }
    
    preload_pbio_format(conn, format->fmformat);

    if (conn->preloaded_formats == NULL) {
	loaded_list = malloc(2*sizeof(*loaded_list));
    } else {
	loaded_list = realloc(conn->preloaded_formats, 
			      sizeof(*loaded_list) * (load_count + 2));
    }
    loaded_list[load_count] = format->fmformat;
    loaded_list[load_count+1] = NULL;
    conn->preloaded_formats = loaded_list;
}